

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

void __thiscall
BCLog::Logger::LogPrintStr
          (Logger *this,string_view str,string_view logging_function,string_view source_file,
          int source_line,LogFlags category,Level level)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::mutex::lock((mutex *)this);
  LogPrintStr_(this,str,logging_function,source_file,source_line,category,level);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BCLog::Logger::LogPrintStr(std::string_view str, std::string_view logging_function, std::string_view source_file, int source_line, BCLog::LogFlags category, BCLog::Level level)
{
    StdLockGuard scoped_lock(m_cs);
    return LogPrintStr_(str, logging_function, source_file, source_line, category, level);
}